

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.h
# Opt level: O0

cmCommand * __thiscall cmCMakeMinimumRequired::Clone(cmCMakeMinimumRequired *this)

{
  cmCMakeMinimumRequired *this_00;
  cmCMakeMinimumRequired *this_local;
  
  this_00 = (cmCMakeMinimumRequired *)operator_new(0x48);
  cmCMakeMinimumRequired(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmCMakeMinimumRequired; }